

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

int loop_type_compar(ON_BrepLoop **ppLoopA,ON_BrepLoop **ppLoopB)

{
  TYPE TVar1;
  TYPE TVar2;
  int iVar3;
  
  TVar1 = (*ppLoopA)->m_type;
  TVar2 = (*ppLoopB)->m_type;
  if (TVar1 == TVar2) {
    return 0;
  }
  if (TVar1 == unknown) {
    iVar3 = 1;
  }
  else {
    if ((int)TVar2 <= (int)TVar1 && TVar2 != unknown) {
      return (uint)((int)TVar2 < (int)TVar1);
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int loop_type_compar(const ON_BrepLoop *const* ppLoopA, const ON_BrepLoop *const* ppLoopB )
{
  const ON_BrepLoop* loopA = *ppLoopA;
  const ON_BrepLoop* loopB = *ppLoopB;
  if ( loopA->m_type == loopB->m_type )
    return 0;
  if ( loopA->m_type == ON_BrepLoop::unknown )
    return 1;
  if ( loopB->m_type == ON_BrepLoop::unknown )
    return -1;
  if ( loopA->m_type < loopB->m_type )
    return -1;
  if ( loopA->m_type > loopB->m_type )
    return 1;
  return 0;
}